

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

Aig_Man_t * Saig_ManDualRail(Aig_Man_t *p,int fMiter)

{
  char *pcVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  Aig_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *p1;
  undefined8 *puVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  long lVar11;
  
  Aig_ManCleanData(p);
  Aig_ManCleanNext(p);
  p_00 = Aig_ManStart(p->vObjs->nSize << 2);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  (p->pConst1->field_5).pData = (void *)((ulong)p_00->pConst1 ^ 1);
  p->pConst1->field_0 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0)p_00->pConst1;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      puVar8 = (undefined8 *)pVVar9->pArray[lVar11];
      pAVar7 = Aig_ObjCreateCi(p_00);
      puVar8[5] = pAVar7;
      pAVar7 = Aig_ObjCreateCi(p_00);
      *puVar8 = pAVar7;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCis;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pAVar7 = (Aig_Obj_t *)pVVar9->pArray[lVar11];
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
        Saig_AndDualRail(p_00,pAVar7,(Aig_Obj_t **)&(pAVar7->field_5).pData,(Aig_Obj_t **)pAVar7);
        pVVar9 = p->vObjs;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar9->nSize);
  }
  if (fMiter == 0) {
    pVVar9 = p->vCos;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar9->pArray[lVar11];
        uVar3 = *(ulong *)((long)pvVar2 + 8);
        if ((uVar3 & 1) == 0) {
          Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar3 + 0x28));
          puVar8 = (undefined8 *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
        }
        else {
          Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar3 & 0xfffffffffffffffe));
          puVar8 = (undefined8 *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28);
        }
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)*puVar8);
        lVar11 = lVar11 + 1;
        pVVar9 = p->vCos;
      } while (lVar11 < pVVar9->nSize);
    }
  }
  else {
    pAVar7 = p_00->pConst1;
    if (0 < p->nRegs) {
      iVar10 = 0;
      do {
        uVar4 = p->nTruePis + iVar10;
        if (((int)uVar4 < 0) || (p->vCis->nSize <= (int)uVar4)) goto LAB_00631ff2;
        puVar8 = (undefined8 *)p->vCis->pArray[uVar4];
        p1 = Aig_Or(p_00,(Aig_Obj_t *)puVar8[5],(Aig_Obj_t *)*puVar8);
        pAVar7 = Aig_And(p_00,pAVar7,p1);
        iVar10 = iVar10 + 1;
      } while (iVar10 < p->nRegs);
    }
    Aig_ObjCreateCo(p_00,pAVar7);
    if (0 < p->nRegs) {
      iVar10 = 0;
      do {
        uVar4 = p->nTruePos + iVar10;
        if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) {
LAB_00631ff2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = p->vCos->pArray[uVar4];
        uVar3 = *(ulong *)((long)pvVar2 + 8);
        if ((uVar3 & 1) == 0) {
          Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar3 + 0x28));
          puVar8 = (undefined8 *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe);
        }
        else {
          Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar3 & 0xfffffffffffffffe));
          puVar8 = (undefined8 *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28);
        }
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)*puVar8);
        iVar10 = iVar10 + 1;
      } while (iVar10 < p->nRegs);
    }
  }
  Aig_ManSetRegNum(p_00,p->nRegs * 2);
  Aig_ManCleanData(p);
  Aig_ManCleanNext(p);
  Aig_ManCleanup(p_00);
  iVar10 = Aig_ManCheck(p_00);
  if (iVar10 == 0) {
    puts("Aig_ManDupSimple(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManDualRail( Aig_Man_t * p, int fMiter )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    Aig_ManCleanData( p );
    Aig_ManCleanNext( p );
    // create the new manager
    pNew = Aig_ManStart( 4*Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs 
    Aig_ManConst1(p)->pData = Aig_ManConst0(pNew);
    Aig_ManConst1(p)->pNext = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pNew );
        pObj->pNext = Aig_ObjCreateCi( pNew );
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        Saig_AndDualRail( pNew, pObj, (Aig_Obj_t **)&pObj->pData, &pObj->pNext );
    // add the POs
    if ( fMiter )
    {
        pMiter = Aig_ManConst1(pNew);
        Saig_ManForEachLo( p, pObj, i )
        {
            pMiter = Aig_And( pNew, pMiter, 
                Aig_Or(pNew, (Aig_Obj_t *)pObj->pData, pObj->pNext) );
        } 
        Aig_ObjCreateCo( pNew, pMiter );
        Saig_ManForEachLi( p, pObj, i )
        {
            if ( !Aig_ObjFaninC0(pObj) )
            {
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
            }
            else
            {
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
            }
        }
    }
    else
    {
        Aig_ManForEachCo( p, pObj, i )
        {
            if ( !Aig_ObjFaninC0(pObj) )
            {
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
            }
            else
            {
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
            }
        }
    }
    Aig_ManSetRegNum( pNew, 2*Aig_ManRegNum(p) );
    Aig_ManCleanData( p );
    Aig_ManCleanNext( p );
    Aig_ManCleanup( pNew );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}